

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::ReadFAHeader(string *fafabName,Vector<char,_std::allocator<char>_> *faHeader)

{
  string FullHdrFileName;
  MPI_Comm *in_stack_00000258;
  undefined1 in_stack_00000267;
  Vector<char,_std::allocator<char>_> *in_stack_00000268;
  string *in_stack_00000270;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ParallelDescriptor::Communicator();
  ParallelDescriptor::ReadAndBcastFile
            (in_stack_00000270,in_stack_00000268,(bool)in_stack_00000267,in_stack_00000258);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void
VisMF::ReadFAHeader (const std::string &fafabName,
                     Vector<char> &faHeader)
{
//    BL_PROFILE("VisMF::ReadFAHeader()");

    std::string FullHdrFileName(fafabName + TheMultiFabHdrFileSuffix);
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, faHeader);
}